

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

void __thiscall QSocks5SocketEnginePrivate::emitReadNotification(QSocks5SocketEnginePrivate *this)

{
  QObject *obj;
  
  obj = *(QObject **)&(this->super_QAbstractSocketEnginePrivate).field_0x8;
  this->readNotificationActivated = true;
  if ((this->readNotificationEnabled == true) && (this->readNotificationPending == false)) {
    this->readNotificationPending = true;
    QMetaObject::invokeMethod<>(obj,"_q_emitPendingReadNotification",QueuedConnection);
    return;
  }
  return;
}

Assistant:

void QSocks5SocketEnginePrivate::emitReadNotification()
{
    Q_Q(QSocks5SocketEngine);
    readNotificationActivated = true;
    if (readNotificationEnabled && !readNotificationPending) {
        QSOCKS5_D_DEBUG << "queueing readNotification";
        readNotificationPending = true;
        QMetaObject::invokeMethod(q, "_q_emitPendingReadNotification", Qt::QueuedConnection);
    }
}